

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O1

vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
* __thiscall
(anonymous_namespace)::
GetLowbdLumaTestParams<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>
          (vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          _func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
          *test_func)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  int b;
  long lVar3;
  _Link_type __x;
  set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
  sizes;
  undefined1 local_80 [40];
  _Rb_tree_node_base local_58;
  undefined8 local_38;
  
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  lVar3 = 0;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = 0;
  local_80._24_8_ = this;
  local_58._M_right = local_58._M_left;
  do {
    local_80._1_3_ = 0;
    local_80[0] = ::block_size_wide[lVar3];
    local_80[4] = ::block_size_high[lVar3];
    local_80._5_3_ = 0;
    __x = (_Link_type)local_80;
    std::
    set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
    ::insert((set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
              *)(local_80 + 0x20),(value_type *)local_80);
    uVar1 = local_80._24_8_;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x16);
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_58._M_left != &local_58) {
    p_Var2 = local_58._M_left;
    do {
      local_80._0_8_ = *(undefined8 *)(p_Var2 + 1);
      local_80._8_4_ = 8;
      local_80._16_8_ = uVar1;
      __x = (_Link_type)local_80;
      std::
      vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_80);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != &local_58);
  }
  std::
  _Rb_tree<(anonymous_namespace)::BlockSize,_(anonymous_namespace)::BlockSize,_std::_Identity<(anonymous_namespace)::BlockSize>,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
  ::_M_erase((_Rb_tree<(anonymous_namespace)::BlockSize,_(anonymous_namespace)::BlockSize,_std::_Identity<(anonymous_namespace)::BlockSize>,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
              *)local_58._M_parent,__x);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestParam<T>> GetLowbdLumaTestParams(T test_func) {
  return GetLumaTestParams({ 8 }, test_func);
}